

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_HatchPattern * Internal_SolidHatchPatternInit(void)

{
  ON_UUID id_00;
  ON_HatchPattern *in_RDI;
  ON_UUID id;
  ON_HatchPattern *hatch_pattern;
  
  ON_HatchPattern::ON_HatchPattern(in_RDI);
  ON_HatchPattern::SetFillType(in_RDI,Solid);
  id_00.Data4[0] = 0x97;
  id_00.Data4[1] = '-';
  id_00.Data4[2] = '\x1f';
  id_00.Data4[3] = 'u';
  id_00.Data4[4] = 0xfe;
  id_00.Data4[5] = 0xf0;
  id_00.Data4[6] = 0xd9;
  id_00.Data4[7] = 'P';
  id_00.Data1 = 0xb319435d;
  id_00.Data2 = 0x86b6;
  id_00.Data3 = 0x4d89;
  Internal_SystemModelComponentInit(id_00,-1,L"Solid",&in_RDI->super_ON_ModelComponent);
  return in_RDI;
}

Assistant:

static ON_HatchPattern Internal_SolidHatchPatternInit()
{
  // {B319435D-86B6-4D89-972D-1F75FEF0D950}
  ON_UUID id = { 0xb319435d, 0x86b6, 0x4d89,{ 0x97, 0x2d, 0x1f, 0x75, 0xfe, 0xf0, 0xd9, 0x50 } };


  ON_HatchPattern hatch_pattern;
  hatch_pattern.SetFillType(ON_HatchPattern::HatchFillType::Solid);
  Internal_SystemModelComponentInit(id, -1, L"Solid", hatch_pattern);

  return hatch_pattern;
}